

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O2

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  PlayerState PVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  vector<CardType,_std::allocator<CardType>_> *pvVar5;
  GameLoop *pGVar6;
  ostream *poVar7;
  Country **neighbour_1;
  pointer ppCVar8;
  Country **neighbour;
  pointer ppCVar9;
  Country **country;
  string local_58;
  undefined4 local_38;
  undefined4 local_34;
  
  pvVar2 = this->subject->pOwnedCountries;
  ppCVar9 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pGVar6 = GameLoop::getInstance();
  pvVar2 = pGVar6->gameMap->pMapCountries;
  if ((long)ppCVar9 - (long)ppCVar3 !=
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"#####################");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*this->subject->pPlayerId);
    poVar7 = std::operator<<(poVar7," is ");
    poVar7 = operator<<(poVar7,*this->subject->currentState);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"#####################");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    PVar1 = *this->subject->currentState;
    if (PVar1 == REINFORCING) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Your current hand: ");
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      std::operator<<(poVar7,'\t');
      pvVar5 = this->subject->pCards->handPointer;
      local_58._M_dataplus._M_p._0_4_ = 0;
      std::
      __count_if<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                ((__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_finish,(_Iter_equals_val<const_int>)&local_58);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      poVar7 = std::operator<<(poVar7," infantry, ");
      pvVar5 = this->subject->pCards->handPointer;
      local_34 = 1;
      std::
      __count_if<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                ((__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_finish,(_Iter_equals_val<const_int>)&local_34);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7," artillery, ");
      pvVar5 = this->subject->pCards->handPointer;
      local_38 = 2;
      std::
      __count_if<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                ((__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
                 (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                 super__Vector_impl_data._M_finish,(_Iter_equals_val<const_int>)&local_38);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7," cavalry");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"You own: ");
      std::endl<char,std::char_traits<char>>(poVar7);
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar9 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppCVar9 != ppCVar3;
          ppCVar9 = ppCVar9 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_(&local_58,*ppCVar9);
        poVar7 = std::operator<<(poVar7,(string *)&local_58);
        poVar7 = std::operator<<(poVar7,": ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar9)->pNumberOfTroops);
        poVar7 = std::operator<<(poVar7," armies");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
    else if (PVar1 == FORTIFYING) {
      poVar7 = std::operator<<((ostream *)&std::cout,"You own:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar9 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppCVar9 != ppCVar3;
          ppCVar9 = ppCVar9 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_(&local_58,*ppCVar9);
        poVar7 = std::operator<<(poVar7,(string *)&local_58);
        poVar7 = std::operator<<(poVar7,": ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar9)->pNumberOfTroops);
        poVar7 = std::operator<<(poVar7," armies");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_58);
        ppCVar4 = ((*ppCVar9)->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppCVar8 = ((*ppCVar9)->pAdjCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start; ppCVar8 != ppCVar4; ppCVar8 = ppCVar8 + 1)
        {
          if (*(*ppCVar8)->pPlayerOwnerId == *this->subject->pPlayerId) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\t\t-> ");
            Map::Country::getCountryName_abi_cxx11_(&local_58,*ppCVar8);
            poVar7 = std::operator<<(poVar7,(string *)&local_58);
            poVar7 = std::operator<<(poVar7,": ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar8)->pNumberOfTroops);
            poVar7 = std::operator<<(poVar7," armies");
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_58);
          }
        }
      }
    }
    else if (PVar1 == ATTACKING) {
      poVar7 = std::operator<<((ostream *)&std::cout,"You own:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar9 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppCVar9 != ppCVar3;
          ppCVar9 = ppCVar9 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,'\t');
        Map::Country::getCountryName_abi_cxx11_(&local_58,*ppCVar9);
        poVar7 = std::operator<<(poVar7,(string *)&local_58);
        poVar7 = std::operator<<(poVar7,": ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar9)->pNumberOfTroops);
        poVar7 = std::operator<<(poVar7," armies");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_58);
        ppCVar4 = ((*ppCVar9)->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppCVar8 = ((*ppCVar9)->pAdjCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start; ppCVar8 != ppCVar4; ppCVar8 = ppCVar8 + 1)
        {
          if (*(*ppCVar8)->pPlayerOwnerId != *this->subject->pPlayerId) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\t\t-> ");
            Map::Country::getCountryName_abi_cxx11_(&local_58,*ppCVar8);
            poVar7 = std::operator<<(poVar7,(string *)&local_58);
            poVar7 = std::operator<<(poVar7,": owned by Player ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar8)->pPlayerOwnerId);
            poVar7 = std::operator<<(poVar7,", with ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar8)->pNumberOfTroops);
            poVar7 = std::operator<<(poVar7," armies");
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_58);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PhaseObserver::update() {

    if (this->subject->getOwnedCountries()->size() ==
        GameLoop::getInstance()->getGameMap()->getMapCountries()->size()) {
        return;
    } else {
        std::cout << std::endl << "#####################" << std::endl;
        std::cout << "Player " << this->subject->getPlayerId() << " is " << subject->getPlayerState() << std::endl;
        std::cout << "#####################" << std::endl << std::endl;

        switch (subject->getPlayerState()) {
            case ATTACKING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() != subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": owned by Player "
                                      << neighbour->getPlayerOwnerID() << ", with " << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case DEFENDING:
                break;
            case FORTIFYING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() == subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": "
                                      << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case REINFORCING:
                std::cout << "Your current hand: " << std::endl << '\t';
                std::cout
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 0)
                        << " infantry, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 1)
                        << " artillery, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 2)
                        << " cavalry" << std::endl;
                std::cout << "You own: " << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                }
                break;
            case IDLE:
                break;
        }
    }
}